

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
upb::generator::MiniTableEnumVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_70 [2];
  long local_60 [2];
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  char *local_18;
  
  local_50 = 1;
  local_48 = "_";
  local_40 = 2;
  local_38 = "_0";
  local_30 = 1;
  local_28 = ".";
  local_20 = 2;
  local_18 = "__";
  absl::lts_20240722::StrReplaceAll_abi_cxx11_(local_70,this,full_name._M_len,&local_50,2);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableEnumVarName(absl::string_view full_name) {
  return MangleName(full_name) + "_enum_init";
}